

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O3

Action __thiscall
psy::C::TypeChecker::visitBinaryExpression_BitwiseShift<psy::C::BinaryExpressionSyntax>
          (TypeChecker *this,BinaryExpressionSyntax *node,Type *leftTy,Type *rightTy)

{
  bool bVar1;
  BasicTypeKind BVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Compilation *this_00;
  Type *pTVar4;
  Action AVar5;
  
  iVar3 = (*(node->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xd9])(node)
  ;
  bVar1 = satisfyIntegerTypeConstraint(this,leftTy,(SyntaxNode *)CONCAT44(extraout_var,iVar3));
  AVar5 = Quit;
  if (bVar1) {
    iVar3 = (*(node->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xdb])
                      (node);
    bVar1 = satisfyIntegerTypeConstraint(this,rightTy,(SyntaxNode *)CONCAT44(extraout_var_00,iVar3))
    ;
    if (bVar1) {
      iVar3 = (*leftTy->_vptr_Type[5])(leftTy);
      BVar2 = BasicType::kind((BasicType *)CONCAT44(extraout_var_01,iVar3));
      BVar2 = performIntegerPromotion(BVar2);
      this_00 = SemanticModel::compilation(this->semaModel_);
      pTVar4 = &Compilation::canonicalBasicType(this_00,BVar2)->super_Type;
      this->ty_ = pTVar4;
      AVar5 = Skip;
    }
  }
  return AVar5;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitBinaryExpression_BitwiseShift(
        const BinaryLikeExprNodeT* node,
        const Type* leftTy,
        const Type* rightTy)
{
    if (!(satisfyIntegerTypeConstraint(leftTy, node->left())
            && satisfyIntegerTypeConstraint(rightTy, node->right()))) {
        return Action::Quit;
    }
    auto promoTyK = performIntegerPromotion(leftTy->asBasicType()->kind());
    ty_ = semaModel_->compilation()->canonicalBasicType(promoTyK);

    return Action::Skip;
}